

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::chainStateFlushed(CWallet *this,ChainstateRole role,CBlockLocator *loc)

{
  WalletDatabase *pWVar1;
  long in_FS_OFFSET;
  WalletBatch batch;
  WalletBatch local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((role != BACKGROUND) && (((this->m_attaching_chain)._M_base._M_i & 1U) == 0)) {
    pWVar1 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar1 == (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    (*pWVar1->_vptr_WalletDatabase[0xe])(&local_30,pWVar1,1);
    local_30.m_database = pWVar1;
    WalletBatch::WriteBestBlock(&local_30,loc);
    if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
        local_30.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl != (DatabaseBatch *)0x0)
    {
      (**(code **)(*(long *)local_30.m_batch._M_t.
                            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl +
                  0x28))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::chainStateFlushed(ChainstateRole role, const CBlockLocator& loc)
{
    // Don't update the best block until the chain is attached so that in case of a shutdown,
    // the rescan will be restarted at next startup.
    if (m_attaching_chain || role == ChainstateRole::BACKGROUND) {
        return;
    }
    WalletBatch batch(GetDatabase());
    batch.WriteBestBlock(loc);
}